

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool generate_wavFile(OpenJTalk *oj,char *txt,FILE *wavfp)

{
  SpeakData *pSVar1;
  _Bool _Var2;
  
  pSVar1 = g_psd;
  if (oj != (OpenJTalk *)0x0) {
    g_psd->sampling_frequency = 0;
    pSVar1->data = (short *)0x0;
    pSVar1->length = 0;
    _Var2 = Open_JTalk_synthesis(oj->open_jtalk,txt,wavfp,(FILE *)0x0);
    return _Var2;
  }
  return false;
}

Assistant:

bool generate_wavFile(OpenJTalk *oj, const char *txt, FILE *wavfp)
{
	if (!oj)
	{
		return false;
	}

	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;

	return Open_JTalk_synthesis(oj->open_jtalk, txt, wavfp, NULL);
}